

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsTypes.cpp
# Opt level: O1

SmallBuffer *
helics::typeConvert(SmallBuffer *__return_storage_ptr__,DataType type,double *vals,size_t size)

{
  value_t vVar1;
  json_value jVar2;
  double dVar3;
  undefined8 __n;
  _Alloc_hider _Var4;
  string *val;
  reference pvVar5;
  long lVar6;
  size_t sVar7;
  char *pcVar8;
  undefined8 uVar9;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> cvec;
  json json;
  json jsonArray;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  double local_c8;
  string local_b8;
  string local_98;
  double local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  json_value jStack_60;
  data local_58;
  json_value local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  
  if (vals == (double *)0x0 || size == 0) {
    emptyBlock(__return_storage_ptr__,type,HELICS_VECTOR);
    return __return_storage_ptr__;
  }
  if (size == 1) {
    typeConvert(__return_storage_ptr__,type,*vals);
    return __return_storage_ptr__;
  }
  switch(type) {
  case HELICS_STRING:
  case HELICS_CHAR:
    local_e8._8_8_ = vals + size;
    local_d8._M_allocated_capacity = 0x3ec404;
    local_d8._8_8_ = 1;
    local_98._M_string_length =
         (size_type)
         ::fmt::v11::detail::value<fmt::v11::context>::
         format_custom<fmt::v11::join_view<double_const*,double_const*,char>,fmt::v11::formatter<fmt::v11::join_view<double_const*,double_const*,char>,char,void>>
    ;
    fmt.size_ = 0xf;
    fmt.data_ = (char *)0x4;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)&local_98;
    local_e8._M_allocated_capacity = (size_type)vals;
    local_98._M_dataplus._M_p = (pointer)&local_e8;
    ::fmt::v11::vformat_abi_cxx11_(&local_b8,(v11 *)0x3d2335,fmt,args);
    local_48 = (json_value)local_b8._M_string_length;
    local_40 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_b8._M_dataplus._M_p;
    ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::convert
              (__return_storage_ptr__,(basic_string_view<char,_std::char_traits<char>_> *)&local_48)
    ;
    local_98.field_2._M_allocated_capacity = local_b8.field_2._M_allocated_capacity;
    uVar9 = local_b8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p == &local_b8.field_2) {
      return __return_storage_ptr__;
    }
    goto LAB_0022b662;
  case HELICS_DOUBLE:
    dVar3 = 0.0;
    lVar6 = 0;
    do {
      dVar3 = dVar3 + *(double *)((long)vals + lVar6) * *(double *)((long)vals + lVar6);
      lVar6 = lVar6 + 8;
    } while (size << 3 != lVar6);
    if (dVar3 < 0.0) {
      local_e8._M_allocated_capacity = (size_type)sqrt(dVar3);
    }
    else {
      local_e8._M_allocated_capacity = (size_type)SQRT(dVar3);
    }
    ValueConverter<double>::convert
              (__return_storage_ptr__,(double *)&local_e8._M_allocated_capacity);
    break;
  case HELICS_INT:
    dVar3 = 0.0;
    lVar6 = 0;
    do {
      dVar3 = dVar3 + *(double *)((long)vals + lVar6) * *(double *)((long)vals + lVar6);
      lVar6 = lVar6 + 8;
    } while (size << 3 != lVar6);
    if (dVar3 < 0.0) {
      dVar3 = sqrt(dVar3);
    }
    else {
      dVar3 = SQRT(dVar3);
    }
LAB_0022b74d:
    local_e8._M_allocated_capacity = (size_type)dVar3;
    goto LAB_0022b752;
  case HELICS_COMPLEX:
    local_e8._M_allocated_capacity = (size_type)*vals;
    local_e8._8_8_ = vals[1];
    ValueConverter<std::complex<double>_>::convert
              (__return_storage_ptr__,(complex<double> *)&local_e8);
    break;
  case HELICS_COMPLEX_VECTOR:
    local_e8._M_allocated_capacity = 0;
    local_e8._8_8_ = (double *)0x0;
    local_d8._M_allocated_capacity = 0;
    std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::reserve
              ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&local_e8,
               size);
    if (size != 0) {
      do {
        local_b8._M_dataplus._M_p = (pointer)0x0;
        std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
        emplace_back<double_const&,double>
                  ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)
                   local_e8._M_local_buf,vals,(double *)&local_b8);
        vals = vals + 1;
        size = size - 1;
      } while (size != 0);
    }
    ValueConverter<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>::
    convert(__return_storage_ptr__,
            (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_allocated_capacity ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      return __return_storage_ptr__;
    }
    pcVar8 = (char *)(local_d8._M_allocated_capacity - local_e8._0_8_);
    uVar9 = local_e8._M_allocated_capacity;
    goto LAB_0022b665;
  case HELICS_NAMED_POINT:
    local_b8._M_string_length = (size_type)(vals + size);
    local_48.object = (object_t *)&local_b8;
    local_b8.field_2._M_allocated_capacity =
         (long)
         "[\"exists\",\"isinit\",\"global_state\",\"version\",\"state\",\"queries\",\"interfaces\",\"filtered_endpoints\","
         + 0x5f;
    local_b8.field_2._8_8_ = 1;
    local_40 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)::fmt::v11::detail::value<fmt::v11::context>::
                  format_custom<fmt::v11::join_view<double_const*,double_const*,char>,fmt::v11::formatter<fmt::v11::join_view<double_const*,double_const*,char>,char,void>>
    ;
    fmt_00.size_ = 0xf;
    fmt_00.data_ = (char *)0x4;
    args_00.field_1.values_ = in_R9.values_;
    args_00.desc_ = (unsigned_long_long)&local_48;
    local_b8._M_dataplus._M_p = (pointer)vals;
    ::fmt::v11::vformat_abi_cxx11_(&local_98,(v11 *)0x3d2335,fmt_00,args_00);
    _Var4._M_p = local_98._M_dataplus._M_p;
    pcVar8 = local_98._M_dataplus._M_p + (long)(_Rep_type *)local_98._M_string_length;
    local_70 = nan("0");
    local_e8._M_allocated_capacity = (size_type)&local_d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,_Var4._M_p,pcVar8);
    local_c8 = local_70;
    ValueConverter<helics::NamedPoint>::convert(__return_storage_ptr__,(NamedPoint *)&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_allocated_capacity != &local_d8) {
      operator_delete((void *)local_e8._M_allocated_capacity,
                      (ulong)(local_d8._M_allocated_capacity + 1));
    }
    uVar9 = local_98._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p == &local_98.field_2) {
      return __return_storage_ptr__;
    }
LAB_0022b662:
    pcVar8 = (char *)(local_98.field_2._M_allocated_capacity + 1);
LAB_0022b665:
    operator_delete((void *)uVar9,(ulong)pcVar8);
    break;
  case HELICS_BOOL:
    dVar3 = 0.0;
    lVar6 = 0;
    do {
      dVar3 = dVar3 + *(double *)((long)vals + lVar6) * *(double *)((long)vals + lVar6);
      lVar6 = lVar6 + 8;
    } while (size << 3 != lVar6);
    if (dVar3 < 0.0) {
      dVar3 = sqrt(dVar3);
    }
    else {
      dVar3 = SQRT(dVar3);
    }
    pcVar8 = "+0";
    if (dVar3 != 0.0) {
      pcVar8 = "*1";
    }
    if (NAN(dVar3)) {
      pcVar8 = "*1";
    }
    local_e8._8_8_ = pcVar8 + 1;
    local_e8._M_allocated_capacity = 1;
    ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::convert
              (__return_storage_ptr__,(basic_string_view<char,_std::char_traits<char>_> *)&local_e8)
    ;
    break;
  case HELICS_TIME:
    dVar3 = 0.0;
    lVar6 = 0;
    do {
      dVar3 = dVar3 + *(double *)((long)vals + lVar6) * *(double *)((long)vals + lVar6);
      lVar6 = lVar6 + 8;
    } while (size << 3 != lVar6);
    if (dVar3 < 0.0) {
      dVar3 = sqrt(dVar3);
    }
    else {
      dVar3 = SQRT(dVar3);
    }
    local_e8._M_allocated_capacity = 0x7fffffffffffffff;
    if (dVar3 <= -9223372036.854765) {
      local_e8._M_allocated_capacity = 0x8000000000000001;
    }
    else if (dVar3 < 9223372036.854765) {
      dVar3 = dVar3 * 1000000000.0 +
              *(double *)(&DAT_003d20a0 + (ulong)(0.0 <= dVar3 * 1000000000.0) * 8);
      goto LAB_0022b74d;
    }
LAB_0022b752:
    ValueConverter<long>::convert(__return_storage_ptr__,(long *)local_e8._M_local_buf);
    break;
  default:
    if (type == HELICS_JSON) {
      local_b8._M_dataplus._M_p = local_b8._M_dataplus._M_p & 0xffffffffffffff00;
      local_b8._M_string_length = 0;
      val = typeNameStringRef_abi_cxx11_(HELICS_VECTOR);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::
      basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_58,val);
      pvVar5 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&local_b8,"type");
      vVar1 = (pvVar5->m_data).m_type;
      (pvVar5->m_data).m_type = local_58.m_type;
      jVar2 = (pvVar5->m_data).m_value;
      (pvVar5->m_data).m_value = local_58.m_value;
      local_58.m_type = vVar1;
      local_58.m_value = jVar2;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_58);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_98,(initializer_list_t)ZEXT816(0),false,array);
      if (size != 0) {
        sVar7 = 0;
        do {
          local_e8._M_allocated_capacity = 0;
          local_e8._8_8_ = (double *)0x0;
          nlohmann::json_abi_v3_11_3::detail::
          external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)7>::
          construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_e8,vals[sVar7]);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::push_back((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                       *)&local_98,
                      (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                       *)&local_e8);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data((data *)&local_e8);
          sVar7 = sVar7 + 1;
        } while (size != sVar7);
      }
      local_68 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_98._M_dataplus._M_p;
      jStack_60 = (json_value)local_98._M_string_length;
      local_98._M_dataplus._M_p = local_98._M_dataplus._M_p & 0xffffffffffffff00;
      local_98._M_string_length = 0;
      pvVar5 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&local_b8,"value");
      vVar1 = (pvVar5->m_data).m_type;
      (pvVar5->m_data).m_type = (value_t)local_68;
      local_68 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)CONCAT71(local_68._1_7_,vVar1);
      jVar2 = (pvVar5->m_data).m_value;
      (pvVar5->m_data).m_value = jStack_60;
      jStack_60 = jVar2;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data((data *)&local_68);
      fileops::generateJsonString((string *)&local_e8,(json *)&local_b8,true);
      __n = local_e8._8_8_;
      uVar9 = local_e8._M_allocated_capacity;
      (__return_storage_ptr__->buffer)._M_elems[0x30] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x31] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x32] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x33] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x34] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x35] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x36] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x37] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x38] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x39] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x3a] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x3b] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x3c] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x3d] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x3e] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x3f] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x20] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x21] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x22] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x23] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x24] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x25] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x26] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x27] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x28] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x29] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x2a] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x2b] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x2c] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x2d] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x2e] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x2f] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x10] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x11] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x12] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x13] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x14] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x15] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x16] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x17] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x18] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x19] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x1a] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x1b] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x1c] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x1d] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x1e] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x1f] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0] = 0;
      (__return_storage_ptr__->buffer)._M_elems[1] = 0;
      (__return_storage_ptr__->buffer)._M_elems[2] = 0;
      (__return_storage_ptr__->buffer)._M_elems[3] = 0;
      (__return_storage_ptr__->buffer)._M_elems[4] = 0;
      (__return_storage_ptr__->buffer)._M_elems[5] = 0;
      (__return_storage_ptr__->buffer)._M_elems[6] = 0;
      (__return_storage_ptr__->buffer)._M_elems[7] = 0;
      (__return_storage_ptr__->buffer)._M_elems[8] = 0;
      (__return_storage_ptr__->buffer)._M_elems[9] = 0;
      (__return_storage_ptr__->buffer)._M_elems[10] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0xb] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0xc] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0xd] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0xe] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0xf] = 0;
      __return_storage_ptr__->bufferSize = 0;
      __return_storage_ptr__->bufferCapacity = 0x40;
      __return_storage_ptr__->heap = (byte *)__return_storage_ptr__;
      __return_storage_ptr__->nonOwning = false;
      __return_storage_ptr__->locked = false;
      __return_storage_ptr__->usingAllocatedBuffer = false;
      __return_storage_ptr__->errorCondition = '\0';
      __return_storage_ptr__->userKey = 0;
      SmallBuffer::reserve(__return_storage_ptr__,local_e8._8_8_);
      __return_storage_ptr__->bufferSize = __n;
      memcpy(__return_storage_ptr__->heap,(void *)uVar9,__n);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_allocated_capacity != &local_d8) {
        operator_delete((void *)local_e8._M_allocated_capacity,
                        (ulong)(local_d8._M_allocated_capacity + 1));
      }
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data((data *)&local_98);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data((data *)&local_b8);
      return __return_storage_ptr__;
    }
  case HELICS_VECTOR:
    ValueConverter<double>::convert(__return_storage_ptr__,vals,size);
    return __return_storage_ptr__;
  }
  return __return_storage_ptr__;
}

Assistant:

SmallBuffer typeConvert(DataType type, const double* vals, size_t size)
{
    if ((vals == nullptr) || (size == 0)) {
        return emptyBlock(type, DataType::HELICS_VECTOR);
    }
    if (size == 1) {
        // treat like a single double
        return typeConvert(type, vals[0]);
    }
    switch (type) {
        case DataType::HELICS_DOUBLE:
            return ValueConverter<double>::convert(vectorNorm(vals, size));
        case DataType::HELICS_TIME:
            return ValueConverter<int64_t>::convert(Time(vectorNorm(vals, size)).getBaseTimeCode());
        case DataType::HELICS_INT:
            return ValueConverter<int64_t>::convert(static_cast<int64_t>(vectorNorm(vals, size)));
        case DataType::HELICS_COMPLEX: {
            const std::complex<double> cval(vals[0], vals[1]);
            return ValueConverter<std::complex<double>>::convert(cval);
        }
        case DataType::HELICS_BOOL:
            return ValueConverter<std::string_view>::convert((vectorNorm(vals, size) != 0.0) ? "1" :
                                                                                               "0");
        case DataType::HELICS_STRING:
        case DataType::HELICS_CHAR:
            return ValueConverter<std::string_view>::convert(helicsVectorString(vals, size));
        case DataType::HELICS_NAMED_POINT:
            return ValueConverter<NamedPoint>::convert(
                NamedPoint{helicsVectorString(vals, size), std::nan("0")});
        case DataType::HELICS_COMPLEX_VECTOR: {
            std::vector<std::complex<double>> cvec;
            cvec.reserve(size);
            for (size_t ii = 0; ii < size; ++ii) {
                cvec.emplace_back(vals[ii], 0.0);
            }
            return ValueConverter<std::vector<std::complex<double>>>::convert(cvec);
        } break;
        case DataType::HELICS_VECTOR:
        default:
            return ValueConverter<double>::convert(vals, size);
        case DataType::HELICS_JSON: {
            nlohmann::json json;
            json["type"] = typeNameStringRef(DataType::HELICS_VECTOR);
            nlohmann::json jsonArray = nlohmann::json::array();
            for (size_t ii = 0; ii < size; ++ii) {
                jsonArray.push_back(vals[ii]);
            }
            json["value"] = std::move(jsonArray);
            return fileops::generateJsonString(json);
        }
    }
}